

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * CreateObjectAllocation(ExpressionContext *ctx,SynBase *source,TypeBase *type)

{
  TypeBase *pTVar1;
  TypeBase *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  ExprBase *pEVar4;
  _func_int **pp_Var5;
  ExprBase *pEVar6;
  undefined4 extraout_var_02;
  TypeRef *pTVar7;
  InplaceStr name;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar3);
  pTVar1 = ctx->typeInt;
  pp_Var5 = (_func_int **)type->size;
  pEVar6->typeID = 6;
  pEVar6->source = source;
  pEVar6->type = pTVar1;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
  pEVar6[1]._vptr_ExprBase = pp_Var5;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar4 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
  pTVar1 = ctx->typeInt;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pp_Var5 = (_func_int **)CONCAT44(extraout_var_01,iVar3);
  pTVar2 = ctx->typeTypeID;
  *(undefined4 *)(pp_Var5 + 1) = 8;
  pp_Var5[2] = (_func_int *)source;
  pp_Var5[3] = (_func_int *)pTVar2;
  pp_Var5[4] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var5 + 5) = 0;
  *pp_Var5 = (_func_int *)&PTR__ExprBase_00248570;
  pp_Var5[6] = (_func_int *)type;
  pEVar4->typeID = 0x12;
  pEVar4->source = source;
  pEVar4->type = pTVar1;
  pEVar4->next = (ExprBase *)0x0;
  pEVar4->listed = false;
  pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002489d8;
  pEVar4[1]._vptr_ExprBase = pp_Var5;
  pEVar4[1].typeID = 0xd;
  name.end = "";
  name.begin = "__newS";
  pEVar6 = CreateFunctionCall2(ctx,source,name,pEVar6,pEVar4,false,true,true);
  if ((pEVar6 == (ExprBase *)0x0) || (pEVar6->typeID != 0x29)) {
    pEVar6 = (ExprBase *)0x0;
  }
  if ((type == (TypeBase *)0x0) || (pEVar4 = pEVar6, type->typeID != 0)) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var_02,iVar3);
    pTVar7 = ExpressionContext::GetReferenceType(ctx,type);
    pEVar4->typeID = 0x12;
    pEVar4->source = source;
    pEVar4->type = &pTVar7->super_TypeBase;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002489d8;
    pEVar4[1]._vptr_ExprBase = (_func_int **)pEVar6;
    pEVar4[1].typeID = 0xd;
  }
  return pEVar4;
}

Assistant:

ExprBase* CreateObjectAllocation(ExpressionContext &ctx, SynBase *source, TypeBase *type)
{
	ExprBase *size = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, type->size);
	ExprBase *typeId = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeInt, new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, type), EXPR_CAST_REINTERPRET);

	ExprFunctionCall *alloc = getType<ExprFunctionCall>(CreateFunctionCall2(ctx, source, InplaceStr("__newS"), size, typeId, false, true, true));

	if(isType<TypeError>(type))
		return alloc;

	return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetReferenceType(type), alloc, EXPR_CAST_REINTERPRET);
}